

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

buf_chunk * get_non_full_tail(bufq *q)

{
  bufc_pool *pbVar1;
  buf_chunk *pbVar2;
  bool bVar3;
  buf_chunk *pbVar4;
  buf_chunk *pbVar5;
  
  pbVar4 = q->tail;
  if ((pbVar4 != (buf_chunk *)0x0) && (pbVar4->w_offset < pbVar4->dlen)) {
    return pbVar4;
  }
  pbVar4 = q->spare;
  if (pbVar4 != (buf_chunk *)0x0) {
    q->spare = pbVar4->next;
    pbVar4->next = (buf_chunk *)0x0;
    pbVar4->r_offset = 0;
    pbVar4->w_offset = 0;
    goto LAB_00112781;
  }
  if ((q->chunk_count < q->max_chunks) || ((q->opts & 1) != 0)) {
    pbVar1 = q->pool;
    if (pbVar1 == (bufc_pool *)0x0) {
      pbVar4 = (buf_chunk *)(*Curl_ccalloc)(1,q->chunk_size + 0x28);
      if (pbVar4 == (buf_chunk *)0x0) goto LAB_0011277f;
      pbVar4->dlen = q->chunk_size;
    }
    else {
      pbVar4 = pbVar1->spare;
      if (pbVar4 == (buf_chunk *)0x0) {
        pbVar4 = (buf_chunk *)(*Curl_ccalloc)(1,pbVar1->chunk_size + 0x28);
        if (pbVar4 != (buf_chunk *)0x0) {
          pbVar4->dlen = pbVar1->chunk_size;
          goto LAB_00112773;
        }
        pbVar4 = (buf_chunk *)0x0;
        bVar3 = false;
      }
      else {
        pbVar1->spare = pbVar4->next;
        pbVar1->spare_count = pbVar1->spare_count - 1;
        pbVar4->next = (buf_chunk *)0x0;
        pbVar4->r_offset = 0;
        pbVar4->w_offset = 0;
LAB_00112773:
        bVar3 = true;
      }
      if (!bVar3) goto LAB_0011277f;
    }
    q->chunk_count = q->chunk_count + 1;
  }
  else {
LAB_0011277f:
    pbVar4 = (buf_chunk *)0x0;
  }
LAB_00112781:
  if (pbVar4 != (buf_chunk *)0x0) {
    pbVar2 = q->tail;
    pbVar5 = (buf_chunk *)&q->tail;
    if (pbVar2 != (buf_chunk *)0x0) {
      pbVar5 = pbVar2;
    }
    pbVar5->next = pbVar4;
    (&q->head)[pbVar2 != (buf_chunk *)0x0] = pbVar4;
  }
  return pbVar4;
}

Assistant:

static struct buf_chunk *get_non_full_tail(struct bufq *q)
{
  struct buf_chunk *chunk;

  if(q->tail && !chunk_is_full(q->tail))
    return q->tail;
  chunk = get_spare(q);
  if(chunk) {
    /* new tail, and possibly new head */
    if(q->tail) {
      q->tail->next = chunk;
      q->tail = chunk;
    }
    else {
      DEBUGASSERT(!q->head);
      q->head = q->tail = chunk;
    }
  }
  return chunk;
}